

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O3

bool __thiscall FIX::TimeRange::isInRange(TimeRange *this,DateTime *dateTime,int day)

{
  undefined1 uVar1;
  DateTime local_48;
  DateTime local_30;
  DateTime local_18;
  
  if ((int)(*(uint *)(this + 0x30) & *(uint *)(this + 0x34)) < 0) {
    local_18._vptr_DateTime = (_func_int **)&PTR__DateTime_00325b88;
    local_18._8_8_ = *(undefined8 *)(this + 8);
    local_18.m_time = *(int64_t *)(this + 0x10);
    local_30._vptr_DateTime = (_func_int **)&PTR__DateTime_00325b88;
    local_30._8_8_ = *(undefined8 *)(this + 0x20);
    local_30.m_time = *(int64_t *)(this + 0x28);
    local_48._vptr_DateTime = (_func_int **)&PTR__DateTime_00325b88;
    local_48.m_date = dateTime->m_date;
    local_48._12_4_ = *(undefined4 *)&dateTime->field_0xc;
    local_48.m_time = dateTime->m_time;
    uVar1 = FIX::TimeRange::isInRange(&local_18,&local_30,&local_48);
  }
  else {
    local_18._vptr_DateTime = (_func_int **)&PTR__DateTime_00325b88;
    local_18._8_8_ = *(undefined8 *)(this + 8);
    local_18.m_time = *(int64_t *)(this + 0x10);
    local_30._vptr_DateTime = (_func_int **)&PTR__DateTime_00325b88;
    local_30._8_8_ = *(undefined8 *)(this + 0x20);
    local_30.m_time = *(int64_t *)(this + 0x28);
    local_48._vptr_DateTime = (_func_int **)&PTR__DateTime_00325b88;
    local_48.m_date = dateTime->m_date;
    local_48._12_4_ = *(undefined4 *)&dateTime->field_0xc;
    local_48.m_time = dateTime->m_time;
    uVar1 = FIX::TimeRange::isInRange
                      (&local_18,&local_30,*(uint *)(this + 0x30),*(uint *)(this + 0x34),&local_48,
                       day);
  }
  return (bool)uVar1;
}

Assistant:

bool isInRange(const DateTime &dateTime, int day) {
    if (m_startDay < 0 && m_endDay < 0) {
      return isInRange(m_startTime, m_endTime, dateTime);
    } else {
      return isInRange(m_startTime, m_endTime, m_startDay, m_endDay, dateTime, day);
    }
  }